

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::CollectMemcopyLdElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  StackSym *pSVar6;
  Func *pFVar7;
  JitArenaAllocator *pJVar8;
  MemCopyCandidate *this_00;
  MemCopyCandidate *local_a0;
  code *local_98;
  undefined8 local_90;
  TrackAllocData local_88;
  MemCopyCandidate *local_60;
  MemCopyCandidate *memcopyInfo;
  Opnd *dst;
  SymID local_48;
  SymID SStack_44;
  bool isIndexPreIncr;
  SymID inductionSymID;
  SymID baseSymID;
  RegOpnd *baseOpnd;
  Opnd *indexOpnd;
  IndirOpnd *src1;
  Loop *loop_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  src1 = (IndirOpnd *)loop;
  loop_local = (Loop *)instr;
  instr_local = (Instr *)this;
  pOVar3 = IR::Instr::GetSrc1(instr);
  bVar2 = IR::Opnd::IsIndirOpnd(pOVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x7ae,"(instr->GetSrc1()->IsIndirOpnd())","instr->GetSrc1()->IsIndirOpnd()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar3 = IR::Instr::GetSrc1((Instr *)loop_local);
  indexOpnd = &IR::Opnd::AsIndirOpnd(pOVar3)->super_Opnd;
  baseOpnd = IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)indexOpnd);
  pRVar5 = IR::IndirOpnd::GetBaseOpnd((IndirOpnd *)indexOpnd);
  _inductionSymID = IR::Opnd::AsRegOpnd(&pRVar5->super_Opnd);
  pSVar6 = IR::Opnd::GetStackSym(&_inductionSymID->super_Opnd);
  SStack_44 = GetVarSymID(this,pSVar6);
  bVar2 = IsAllowedForMemOpt(this,(Instr *)loop_local,false,_inductionSymID,&baseOpnd->super_Opnd);
  if (bVar2) {
    pSVar6 = IR::Opnd::GetStackSym(&baseOpnd->super_Opnd);
    local_48 = GetVarSymID(this,pSVar6);
    bVar2 = IsSymIDInductionVariable(this,local_48,(Loop *)src1);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x7bb,"(IsSymIDInductionVariable(inductionSymID, loop))",
                         "IsSymIDInductionVariable(inductionSymID, loop)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    Loop::EnsureMemOpVariablesInitialized((Loop *)src1);
    dst._7_1_ = JsUtil::
                BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey((BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                               *)(src1[5].m_indexOpnd)->m_sym,&local_48);
    memcopyInfo = (MemCopyCandidate *)IR::Instr::GetDst((Instr *)loop_local);
    bVar2 = IR::Opnd::IsRegOpnd((Opnd *)memcopyInfo);
    if (bVar2) {
      pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)memcopyInfo);
      pSVar6 = IR::Opnd::GetStackSym(&pRVar5->super_Opnd);
      bVar2 = StackSym::IsSingleDef(pSVar6);
      if (bVar2) {
        pFVar7 = Func::GetTopFunc(this->func);
        pJVar8 = pFVar7->m_fg->alloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_88,(type_info *)&Loop::MemCopyCandidate::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                   ,0x7c6);
        pJVar8 = (JitArenaAllocator *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pJVar8,&local_88);
        local_98 = Memory::JitArenaAllocator::Alloc;
        local_90 = 0;
        this_00 = (MemCopyCandidate *)new<Memory::JitArenaAllocator>(0x28,pJVar8,0x4e98c0);
        Loop::MemCopyCandidate::MemCopyCandidate(this_00);
        this_00->ldBase = SStack_44;
        this_00->ldCount = '\x01';
        (this_00->super_MemOpCandidate).count = '\0';
        (this_00->super_MemOpCandidate).bIndexAlreadyChanged = (bool)(dst._7_1_ & 1);
        (this_00->super_MemOpCandidate).base = 0xffffffff;
        (this_00->super_MemOpCandidate).index = local_48;
        local_60 = this_00;
        pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)memcopyInfo);
        pSVar6 = IR::Opnd::GetStackSym(&pRVar5->super_Opnd);
        local_60->transferSym = pSVar6;
        local_a0 = local_60;
        SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                   ((src1[5].m_indexOpnd)->super_Opnd)._vptr_Opnd,(MemOpCandidate **)&local_a0);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::CollectMemcopyLdElementI(IR::Instr *instr, Loop *loop)
{
    Assert(instr->GetSrc1()->IsIndirOpnd());

    IR::IndirOpnd *src1 = instr->GetSrc1()->AsIndirOpnd();
    IR::Opnd *indexOpnd = src1->GetIndexOpnd();
    IR::RegOpnd *baseOpnd = src1->GetBaseOpnd()->AsRegOpnd();
    SymID baseSymID = GetVarSymID(baseOpnd->GetStackSym());

    if (!IsAllowedForMemOpt(instr, false, baseOpnd, indexOpnd))
    {
        return false;
    }

    SymID inductionSymID = GetVarSymID(indexOpnd->GetStackSym());
    Assert(IsSymIDInductionVariable(inductionSymID, loop));

    loop->EnsureMemOpVariablesInitialized();
    bool isIndexPreIncr = loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID);

    IR::Opnd * dst = instr->GetDst();
    if (!dst->IsRegOpnd() || !dst->AsRegOpnd()->GetStackSym()->IsSingleDef())
    {
        return false;
    }

    Loop::MemCopyCandidate* memcopyInfo = memcopyInfo = JitAnewStruct(this->func->GetTopFunc()->m_fg->alloc, Loop::MemCopyCandidate);
    memcopyInfo->ldBase = baseSymID;
    memcopyInfo->ldCount = 1;
    memcopyInfo->count = 0;
    memcopyInfo->bIndexAlreadyChanged = isIndexPreIncr;
    memcopyInfo->base = Js::Constants::InvalidSymID; //need to find the stElem first
    memcopyInfo->index = inductionSymID;
    memcopyInfo->transferSym = dst->AsRegOpnd()->GetStackSym();
    loop->memOpInfo->candidates->Prepend(memcopyInfo);
    return true;
}